

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O3

uint16_t wirehair::GetDenseSeed(uint N,uint dense_count)

{
  if (N < 0x41) {
    return *(uint16_t *)(kTinyDenseSeeds + (ulong)N * 2);
  }
  if (N < 0x800) {
    return (uint16_t)(byte)kSmallDenseSeeds[N - 0x41];
  }
  return (uint16_t)(byte)kDenseSeeds[dense_count >> 2];
}

Assistant:

uint16_t GetDenseSeed(unsigned N, unsigned dense_count)
{
    if (N < kTinyTableCount) {
        // Get seed from tiny table (16-bit)
        return kTinyDenseSeeds[N];
    }
    else if (N < (kTinyTableCount + kSmallTableCount)) {
        // Get seed from small table (8-bit)
        return kSmallDenseSeeds[N - kTinyTableCount];
    }

    CAT_DEBUG_ASSERT(N >= kSmallTableCount && N <= 64000);
    CAT_DEBUG_ASSERT(dense_count % 4 == 2);

    const unsigned tableIndex = dense_count / 4;

    CAT_DEBUG_ASSERT(tableIndex < kDenseSeedCount);

    return kDenseSeeds[tableIndex];
}